

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect.c
# Opt level: O0

char * reflect_print_info(void)

{
  return 
  "Reflect Library 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n"
  ;
}

Assistant:

const char *reflect_print_info(void)
{
	static const char reflect_info[] =
		"Reflect Library " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef REFLECT_STATIC_DEFINE
		"Compiled as static library type"
#else
		"Compiled as shared library type"
#endif

		"\n";

	return reflect_info;
}